

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_gstream.c
# Opt level: O1

HTS_Boolean
HTS_GStreamSet_create
          (HTS_GStreamSet *gss,HTS_PStreamSet *pss,size_t stage,HTS_Boolean use_log_gain,
          size_t sampling_rate,size_t fperiod,double alpha,double beta,HTS_Boolean *stop,
          double volume,HTS_Audio *audio)

{
  undefined1 auVar1 [16];
  HTS_Boolean HVar2;
  size_t sVar3;
  HTS_GStream *pHVar4;
  size_t sVar5;
  double **ppdVar6;
  double *pdVar7;
  char *message;
  ulong uVar8;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  HTS_Vocoder v;
  HTS_Vocoder local_130;
  
  if ((gss->gstream == (HTS_GStream *)0x0) && (gss->gspeech == (double *)0x0)) {
    sVar3 = HTS_PStreamSet_get_nstream(pss);
    gss->nstream = sVar3;
    sVar3 = HTS_PStreamSet_get_total_frame(pss);
    gss->total_frame = sVar3;
    gss->total_nsample = sVar3 * fperiod;
    pHVar4 = (HTS_GStream *)HTS_calloc(gss->nstream,0x10);
    gss->gstream = pHVar4;
    if (gss->nstream != 0) {
      sVar3 = 0;
      do {
        sVar5 = HTS_PStreamSet_get_vector_length(pss,sVar3);
        gss->gstream[sVar3].vector_length = sVar5;
        ppdVar6 = (double **)HTS_calloc(gss->total_frame,8);
        gss->gstream[sVar3].par = ppdVar6;
        if (gss->total_frame != 0) {
          uVar8 = 0;
          do {
            pdVar7 = (double *)HTS_calloc(gss->gstream[sVar3].vector_length,8);
            gss->gstream[sVar3].par[uVar8] = pdVar7;
            uVar8 = uVar8 + 1;
          } while (uVar8 < gss->total_frame);
        }
        sVar3 = sVar3 + 1;
      } while (sVar3 < gss->nstream);
    }
    pdVar7 = (double *)HTS_calloc(gss->total_nsample,8);
    gss->gspeech = pdVar7;
    uVar8 = gss->nstream;
    if (uVar8 != 0) {
      sVar3 = 0;
      do {
        HVar2 = HTS_PStreamSet_is_msd(pss,sVar3);
        if (HVar2 == '\0') {
          if (gss->total_frame != 0) {
            sVar5 = 0;
            do {
              if (gss->gstream[sVar3].vector_length != 0) {
                sVar10 = 0;
                do {
                  dVar12 = HTS_PStreamSet_get_parameter(pss,sVar3,sVar5,sVar10);
                  gss->gstream[sVar3].par[sVar5][sVar10] = dVar12;
                  sVar10 = sVar10 + 1;
                } while (sVar10 < gss->gstream[sVar3].vector_length);
              }
              sVar5 = sVar5 + 1;
            } while (sVar5 < gss->total_frame);
          }
        }
        else if (gss->total_frame != 0) {
          sVar5 = 0;
          sVar10 = 0;
          do {
            HVar2 = HTS_PStreamSet_get_msd_flag(pss,sVar3,sVar10);
            auVar1 = _DAT_00182100;
            sVar9 = gss->gstream[sVar3].vector_length;
            if (HVar2 == '\x01') {
              if (sVar9 != 0) {
                sVar9 = 0;
                do {
                  dVar12 = HTS_PStreamSet_get_parameter(pss,sVar3,sVar5,sVar9);
                  gss->gstream[sVar3].par[sVar10][sVar9] = dVar12;
                  sVar9 = sVar9 + 1;
                } while (sVar9 < gss->gstream[sVar3].vector_length);
              }
              sVar5 = sVar5 + 1;
            }
            else if (sVar9 != 0) {
              pdVar7 = gss->gstream[sVar3].par[sVar10];
              lVar11 = sVar9 - 1;
              auVar13._8_4_ = (int)lVar11;
              auVar13._0_8_ = lVar11;
              auVar13._12_4_ = (int)((ulong)lVar11 >> 0x20);
              auVar13 = auVar13 ^ _DAT_00182100;
              uVar8 = 0;
              auVar14 = _DAT_001820f0;
              do {
                auVar15 = auVar14 ^ auVar1;
                if ((bool)(~(auVar13._4_4_ < auVar15._4_4_ ||
                            auVar13._0_4_ < auVar15._0_4_ && auVar15._4_4_ == auVar13._4_4_) & 1)) {
                  pdVar7[uVar8] = -10000000000.0;
                }
                if (auVar15._12_4_ <= auVar13._12_4_ &&
                    (auVar15._8_4_ <= auVar13._8_4_ || auVar15._12_4_ != auVar13._12_4_)) {
                  pdVar7[uVar8 + 1] = -10000000000.0;
                }
                uVar8 = uVar8 + 2;
                lVar11 = auVar14._8_8_;
                auVar14._0_8_ = auVar14._0_8_ + 2;
                auVar14._8_8_ = lVar11 + 2;
              } while ((sVar9 + 1 & 0xfffffffffffffffe) != uVar8);
            }
            sVar10 = sVar10 + 1;
          } while (sVar10 < gss->total_frame);
        }
        sVar3 = sVar3 + 1;
        uVar8 = gss->nstream;
      } while (sVar3 < uVar8);
    }
    if ((uVar8 & 0xfffffffffffffffe) == 2) {
      sVar3 = HTS_PStreamSet_get_vector_length(pss,1);
      if (sVar3 == 1) {
        if ((gss->nstream < 3) || ((gss->gstream[2].vector_length & 1) != 0)) {
          HTS_Vocoder_initialize
                    (&local_130,gss->gstream->vector_length - 1,stage,use_log_gain,sampling_rate,
                     fperiod);
          if (gss->nstream < 3) {
            sVar3 = 0;
          }
          else {
            sVar3 = gss->gstream[2].vector_length;
          }
          if (gss->total_frame != 0) {
            lVar11 = 0;
            pdVar7 = (double *)0x0;
            uVar8 = 0;
            do {
              if (*stop != '\0') break;
              if (2 < gss->nstream) {
                pdVar7 = gss->gstream[2].par[uVar8];
              }
              pHVar4 = gss->gstream;
              HTS_Vocoder_synthesize
                        (&local_130,pHVar4->vector_length - 1,*pHVar4[1].par[uVar8],
                         pHVar4->par[uVar8],sVar3,pdVar7,alpha,beta,volume,
                         (double *)((long)gss->gspeech + lVar11),audio);
              uVar8 = uVar8 + 1;
              lVar11 = lVar11 + fperiod * 8;
            } while (uVar8 < gss->total_frame);
          }
          HTS_Vocoder_clear(&local_130);
          if (audio == (HTS_Audio *)0x0) {
            return '\x01';
          }
          HTS_Audio_flush(audio);
          return '\x01';
        }
        message = 
        "HTS_GStreamSet_create: The number of low-pass filter coefficient should be odd numbers.";
      }
      else {
        message = "HTS_GStreamSet_create: The size of lf0 static vector should be 1.\n";
      }
    }
    else {
      message = "HTS_GStreamSet_create: The number of streams should be 2 or 3.\n";
    }
    HTS_error(1,message);
    HTS_GStreamSet_clear(gss);
  }
  else {
    HTS_error(1,"HTS_GStreamSet_create: HTS_GStreamSet is not initialized.\n");
  }
  return '\0';
}

Assistant:

HTS_Boolean HTS_GStreamSet_create(HTS_GStreamSet * gss, HTS_PStreamSet * pss, size_t stage, HTS_Boolean use_log_gain, size_t sampling_rate, size_t fperiod, double alpha, double beta, HTS_Boolean * stop, double volume, HTS_Audio * audio)
{
   size_t i, j, k;
   size_t msd_frame;
   HTS_Vocoder v;
   size_t nlpf = 0;
   double *lpf = NULL;

   /* check */
   if (gss->gstream || gss->gspeech) {
      HTS_error(1, "HTS_GStreamSet_create: HTS_GStreamSet is not initialized.\n");
      return FALSE;
   }

   /* initialize */
   gss->nstream = HTS_PStreamSet_get_nstream(pss);
   gss->total_frame = HTS_PStreamSet_get_total_frame(pss);
   gss->total_nsample = fperiod * gss->total_frame;
   gss->gstream = (HTS_GStream *) HTS_calloc(gss->nstream, sizeof(HTS_GStream));
   for (i = 0; i < gss->nstream; i++) {
      gss->gstream[i].vector_length = HTS_PStreamSet_get_vector_length(pss, i);
      gss->gstream[i].par = (double **) HTS_calloc(gss->total_frame, sizeof(double *));
      for (j = 0; j < gss->total_frame; j++)
         gss->gstream[i].par[j] = (double *) HTS_calloc(gss->gstream[i].vector_length, sizeof(double));
   }
   gss->gspeech = (double *) HTS_calloc(gss->total_nsample, sizeof(double));

   /* copy generated parameter */
   for (i = 0; i < gss->nstream; i++) {
      if (HTS_PStreamSet_is_msd(pss, i)) {      /* for MSD */
         for (j = 0, msd_frame = 0; j < gss->total_frame; j++)
            if (HTS_PStreamSet_get_msd_flag(pss, i, j) == TRUE) {
               for (k = 0; k < gss->gstream[i].vector_length; k++)
                  gss->gstream[i].par[j][k] = HTS_PStreamSet_get_parameter(pss, i, msd_frame, k);
               msd_frame++;
            } else
               for (k = 0; k < gss->gstream[i].vector_length; k++)
                  gss->gstream[i].par[j][k] = HTS_NODATA;
      } else {                  /* for non MSD */
         for (j = 0; j < gss->total_frame; j++)
            for (k = 0; k < gss->gstream[i].vector_length; k++)
               gss->gstream[i].par[j][k] = HTS_PStreamSet_get_parameter(pss, i, j, k);
      }
   }

   /* check */
   if (gss->nstream != 2 && gss->nstream != 3) {
      HTS_error(1, "HTS_GStreamSet_create: The number of streams should be 2 or 3.\n");
      HTS_GStreamSet_clear(gss);
      return FALSE;
   }
   if (HTS_PStreamSet_get_vector_length(pss, 1) != 1) {
      HTS_error(1, "HTS_GStreamSet_create: The size of lf0 static vector should be 1.\n");
      HTS_GStreamSet_clear(gss);
      return FALSE;
   }
   if (gss->nstream >= 3 && gss->gstream[2].vector_length % 2 == 0) {
      HTS_error(1, "HTS_GStreamSet_create: The number of low-pass filter coefficient should be odd numbers.");
      HTS_GStreamSet_clear(gss);
      return FALSE;
   }

   /* synthesize speech waveform */
   HTS_Vocoder_initialize(&v, gss->gstream[0].vector_length - 1, stage, use_log_gain, sampling_rate, fperiod);
   if (gss->nstream >= 3)
      nlpf = gss->gstream[2].vector_length;
   for (i = 0; i < gss->total_frame && (*stop) == FALSE; i++) {
      j = i * fperiod;
      if (gss->nstream >= 3)
         lpf = &gss->gstream[2].par[i][0];
      HTS_Vocoder_synthesize(&v, gss->gstream[0].vector_length - 1, gss->gstream[1].par[i][0], &gss->gstream[0].par[i][0], nlpf, lpf, alpha, beta, volume, &gss->gspeech[j], audio);
   }
   HTS_Vocoder_clear(&v);
   if (audio)
      HTS_Audio_flush(audio);

   return TRUE;
}